

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

stumpless_target * stumpless_set_target_default_msgid(stumpless_target *target,char *msgid)

{
  _Bool _Var1;
  size_t local_28;
  size_t new_length;
  char *msgid_local;
  stumpless_target *target_local;
  
  new_length = (size_t)msgid;
  msgid_local = (char *)target;
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if (msgid == (char *)0x0) {
    raise_argument_empty("msgid was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    _Var1 = validate_msgid(msgid,&local_28);
    if (_Var1) {
      clear_error();
      lock_target((stumpless_target *)msgid_local);
      memcpy(msgid_local + 0x60,(void *)new_length,local_28);
      *(size_t *)(msgid_local + 0x80) = local_28;
      unlock_target((stumpless_target *)msgid_local);
      target_local = (stumpless_target *)msgid_local;
    }
    else {
      target_local = (stumpless_target *)0x0;
    }
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_target_default_msgid( struct stumpless_target *target,
                                    const char *msgid ) {
  size_t new_length;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( msgid );

  if( unlikely( !validate_msgid( msgid, &new_length ) ) ) {
    return NULL;
  }

  clear_error(  );

  lock_target( target );
  memcpy( target->default_msgid, msgid, new_length );
  target->default_msgid_length = new_length;
  unlock_target( target );

  return target;
}